

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall
cmDocumentation::SetSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  cmDocumentationSection local_a0;
  undefined1 local_58 [8];
  cmDocumentationSection sec;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs_local;
  char *name_local;
  cmDocumentation *this_local;
  
  sec.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)docs;
  cmDocumentationSection::cmDocumentationSection((cmDocumentationSection *)local_58,name);
  cmDocumentationSection::Append
            ((cmDocumentationSection *)local_58,
             (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
             sec.Entries.
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  cmDocumentationSection::cmDocumentationSection(&local_a0,(cmDocumentationSection *)local_58);
  SetSection(this,name,&local_a0);
  cmDocumentationSection::~cmDocumentationSection(&local_a0);
  cmDocumentationSection::~cmDocumentationSection((cmDocumentationSection *)local_58);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 std::vector<cmDocumentationEntry>& docs)
{
  cmDocumentationSection sec{ name };
  sec.Append(docs);
  this->SetSection(name, std::move(sec));
}